

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O1

bool __thiscall
chatra::TemporaryObject::findConstructor(TemporaryObject *this,Class *cl,StringId subName)

{
  pointer pAVar1;
  Method *pMVar2;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_48;
  
  local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar2 = MethodTable::find(&cl->constructors,(Class *)0x0,Init,subName,&this->args,&local_48);
  if (local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (pMVar2 != (Method *)0x0) {
    this->type = Constructor;
    (this->targetRef).node = (ReferenceNode *)0x0;
    this->cl = cl;
    this->methodTable = &cl->constructors;
    this->method0 = pMVar2;
    this->method1 = (Method *)0x0;
    this->methodHasArgs = true;
    this->hasName = false;
    this->hasArgs = false;
    this->hasSetArg = false;
    this->hasVarArgOp = false;
    pAVar1 = (this->args).
             super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
      (this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar1;
    }
    resolveNativeMethod(this,Init,pMVar2->subName);
  }
  return pMVar2 != (Method *)0x0;
}

Assistant:

bool TemporaryObject::findConstructor(const Class* cl, StringId subName) {
	chatra_assert(hasArgs);
	auto& table = cl->refConstructors();
	auto* constructor = table.find(nullptr, StringId::Init, subName, args, {});
	if (constructor == nullptr)
		return false;
	setConstructor(cl, &table, constructor);
	resolveNativeMethod(StringId::Init, constructor->subName);
	return true;
}